

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<char>::assign<char_const*,q20::identity>
          (QArrayDataPointer<char> *this,char *first,char *last)

{
  Data *pDVar1;
  QArrayData *data;
  char *pcVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *__dest;
  size_t __n;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = (long)last - (long)first;
  pDVar1 = this->d;
  if (pDVar1 != (Data *)0x0) {
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1 == (Data *)0x0) {
        lVar3 = 0;
      }
      else {
        lVar3 = (pDVar1->super_QArrayData).alloc;
      }
      if (lVar4 <= lVar3) goto LAB_00222964;
    }
    if (pDVar1 != (Data *)0x0) {
      lVar3 = (pDVar1->super_QArrayData).alloc;
      if (lVar3 <= lVar4) {
        lVar3 = lVar4;
      }
      if (((pDVar1->super_QArrayData).flags.super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>.
           super_QFlagsStorage<QArrayData::ArrayOption>.i & 1) != 0) {
        lVar4 = lVar3;
      }
    }
  }
  local_38 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pcVar2 = (char *)QArrayData::allocate1(&local_38,lVar4,KeepSize);
  data = &this->d->super_QArrayData;
  this->d = (Data *)local_38;
  this->ptr = pcVar2;
  this->size = 0;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,1,0x10);
    }
  }
LAB_00222964:
  pcVar2 = this->ptr;
  lVar4 = (long)pcVar2 -
          ((ulong)((long)&this->d[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0);
  if (this->d == (Data *)0x0) {
    lVar4 = 0;
  }
  lVar3 = this->size;
  __dest = pcVar2 + -lVar4;
  if (lVar4 != 0) {
    lVar5 = -lVar4;
    this->ptr = pcVar2 + -lVar4;
    do {
      if (first == last) {
        __dest = pcVar2 + lVar5;
        goto LAB_002229fa;
      }
      pcVar2[lVar5] = *first;
      first = first + 1;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0);
    this->size = this->size + lVar4;
    __dest = pcVar2;
  }
  if (first != last) {
    __n = (long)last - (long)first;
    do {
      if (__dest == pcVar2 + lVar3) {
        memmove(__dest,first,__n);
        __dest = __dest + __n;
        break;
      }
      *__dest = *first;
      __dest = __dest + 1;
      first = first + 1;
      __n = __n - 1;
    } while (first != last);
  }
LAB_002229fa:
  this->size = (long)__dest - (long)this->ptr;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void assign(InputIterator first, InputIterator last, Projection proj = {})
    {
        // This function only provides the basic exception guarantee.
        constexpr bool IsFwdIt = std::is_convertible_v<
                typename std::iterator_traits<InputIterator>::iterator_category,
                std::forward_iterator_tag>;
        constexpr bool IsIdentity = std::is_same_v<Projection, q20::identity>;

        if constexpr (IsFwdIt) {
            const qsizetype n = std::distance(first, last);
            if (needsDetach() || n > constAllocatedCapacity()) {
                QArrayDataPointer allocated(detachCapacity(n));
                swap(allocated);
            }
        } else if (needsDetach()) {
            QArrayDataPointer allocated(allocatedCapacity());
            swap(allocated);
            // We don't want to copy data that we know we'll overwrite
        }

        auto offset = freeSpaceAtBegin();
        const auto capacityBegin = begin() - offset;
        const auto prependBufferEnd = begin();

        if constexpr (!std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
            // If construction can throw, and we have freeSpaceAtBegin(),
            // it's easiest to just clear the container and start fresh.
            // The alternative would be to keep track of two active, disjoint ranges.
            if (offset) {
                (*this)->truncate(0);
                setBegin(capacityBegin);
                offset = 0;
            }
        }

        auto dst = capacityBegin;
        const auto dend = end();
        if (offset) { // avoids dead stores
            setBegin(capacityBegin); // undo prepend optimization

            // By construction, the following loop is nothrow!
            // (otherwise, we can't reach here)
            // Assumes InputIterator operations don't throw.
            // (but we can't statically assert that, as these operations
            //  have preconditons, so typically aren't noexcept)
            while (true) {
                if (dst == prependBufferEnd) {  // ran out of prepend buffer space
                    size += offset;
                    // we now have a contiguous buffer, continue with the main loop:
                    break;
                }
                if (first == last) {            // ran out of elements to assign
                    std::destroy(prependBufferEnd, dend);
                    size = dst - begin();
                    return;
                }
                // construct element in prepend buffer
                q20::construct_at(dst, std::invoke(proj, *first));
                ++dst;
                ++first;
            }
        }

        while (true) {
            if (first == last) {    // ran out of elements to assign
                std::destroy(dst, dend);
                break;
            }
            if (dst == dend) {      // ran out of existing elements to overwrite
                if constexpr (IsFwdIt && IsIdentity) {
                    dst = std::uninitialized_copy(first, last, dst);
                    break;
                } else if constexpr (IsFwdIt && !IsIdentity
                           && std::is_nothrow_constructible_v<T, decltype(std::invoke(proj, *first))>) {
                    for (; first != last; ++dst, ++first)   // uninitialized_copy with projection
                        q20::construct_at(dst, std::invoke(proj, *first));
                    break;
                } else {
                    do {
                        (*this)->emplace(size, std::invoke(proj, *first));
                    } while (++first != last);
                    return;         // size() is already correct (and dst invalidated)!
                }
            }
            *dst = std::invoke(proj, *first);    // overwrite existing element
            ++dst;
            ++first;
        }
        size = dst - begin();
    }